

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

char * dmrC_show_instruction(dmr_C *C,instruction *insn)

{
  basic_block_list *pbVar1;
  basic_block *pbVar2;
  symbol *psVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  undefined1 local_100 [8];
  ptr_list_iter argiter__;
  pseudo *arg;
  symbol *sym_3;
  symbol *sym_2;
  ptr_list_iter phiiter___1;
  char *s;
  pseudo_t phi_1;
  ptr_list_iter phiiter__;
  instruction *phi;
  ptr_list_iter jmpiter___1;
  multijmp *jmp_1;
  ptr_list_iter jmpiter__;
  multijmp *jmp;
  symbol *sym_1;
  expression *expr;
  symbol *sym;
  char *op;
  char *buf;
  int opcode;
  instruction *insn_local;
  dmr_C *C_local;
  
  uVar5 = *(uint *)insn & 0xff;
  op = C->L->buffer;
  if (insn->bb == (basic_block *)0x0) {
    iVar6 = sprintf(op,"# ");
    op = op + iVar6;
  }
  if (uVar5 < 0x41) {
    if (opcodes[(int)uVar5] == (char *)0x0) {
      iVar6 = sprintf(op,"opcode:%d",(ulong)uVar5);
    }
    else {
      iVar6 = sprintf(op,"%s",opcodes[(int)uVar5]);
    }
    op = op + iVar6;
    if ((insn->type == (symbol *)0x0) || (iVar6 = dmrC_is_float_type(C->S,insn->type), iVar6 == 0))
    {
      if (*(uint *)insn >> 8 != 0) {
        iVar6 = sprintf(op,".%d",(ulong)(*(uint *)insn >> 8));
        op = op + iVar6;
      }
    }
    else {
      iVar6 = sprintf(op,".f%d",(ulong)(*(uint *)insn >> 8));
      op = op + iVar6;
    }
    if ((insn->type != (symbol *)0x0) && (iVar6 = dmrC_is_ptr_type(insn->type), iVar6 != 0)) {
      iVar6 = sprintf(op,"*");
      op = op + iVar6;
    }
    memset(op,0x20,0x14);
    op = op + 1;
  }
  if (op < C->L->buffer + 0xc) {
    op = C->L->buffer + 0xc;
  }
  switch(uVar5) {
  case 2:
    if (((insn->field_6).field_1.bb_true != (basic_block *)0x0) &&
       ((insn->field_6).field_1.bb_true != (basic_block *)&C->L->void_pseudo)) {
      pcVar9 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
      iVar6 = sprintf(op,"%s",pcVar9);
      op = op + iVar6;
    }
    break;
  case 3:
    iVar6 = sprintf(op,".L%u",(ulong)((insn->field_6).field_1.bb_true)->nr);
    op = op + iVar6;
    break;
  case 4:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar6 = sprintf(op,"%s, .L%u, .L%u",pcVar9,(ulong)((insn->field_6).field_1.bb_true)->nr,
                    (ulong)((insn->field_6).field_1.bb_false)->nr);
    op = op + iVar6;
    break;
  case 5:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar6 = sprintf(op,"%s",pcVar9);
    op = op + iVar6;
    ptrlist_forward_iterator((ptr_list_iter *)&jmp_1,(ptr_list *)(insn->field_6).field_1.bb_true);
    jmpiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&jmp_1);
    while (jmpiter__._16_8_ != 0) {
      if (*(long *)(jmpiter__._16_8_ + 8) == *(long *)(jmpiter__._16_8_ + 0x10)) {
        iVar6 = sprintf(op,", %lld -> .L%u",*(undefined8 *)(jmpiter__._16_8_ + 8),
                        (ulong)*(uint *)(*(long *)jmpiter__._16_8_ + 0x48));
      }
      else if (*(long *)(jmpiter__._16_8_ + 8) < *(long *)(jmpiter__._16_8_ + 0x10)) {
        iVar6 = sprintf(op,", %lld ... %lld -> .L%u",*(undefined8 *)(jmpiter__._16_8_ + 8),
                        *(undefined8 *)(jmpiter__._16_8_ + 0x10),
                        (ulong)*(uint *)(*(long *)jmpiter__._16_8_ + 0x48));
      }
      else {
        iVar6 = sprintf(op,", default -> .L%u",(ulong)*(uint *)(*(long *)jmpiter__._16_8_ + 0x48));
      }
      op = op + iVar6;
      jmpiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&jmp_1);
    }
    break;
  default:
    break;
  case 7:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar6 = sprintf(op,"%s",pcVar9);
    op = op + iVar6;
    ptrlist_forward_iterator((ptr_list_iter *)&phi,(ptr_list *)(insn->field_6).field_1.bb_true);
    jmpiter___1._16_8_ = ptrlist_iter_next((ptr_list_iter *)&phi);
    while (jmpiter___1._16_8_ != 0) {
      iVar6 = sprintf(op,", .L%u",(ulong)*(uint *)(*(long *)jmpiter___1._16_8_ + 0x48));
      op = op + iVar6;
      jmpiter___1._16_8_ = ptrlist_iter_next((ptr_list_iter *)&phi);
    }
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_6.src2);
    iVar6 = sprintf(op,"%s <- %s, %s",pcVar9,pcVar10,pcVar8);
    op = op + iVar6;
    break;
  case 0x23:
  case 0x24:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(op,"%s <- %s",pcVar9,pcVar10);
    op = op + iVar6;
    break;
  case 0x25:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_6.src2);
    pcVar7 = dmrC_show_pseudo(C,(insn->field_6).field_6.src3);
    iVar6 = sprintf(op,"%s <- %s, %s, %s",pcVar9,pcVar10,pcVar8,pcVar7);
    op = op + iVar6;
    break;
  case 0x29:
  case 0x3a:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    uVar5 = (insn->field_6).field_5.offset;
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(op,"%s <- %d[%s]",pcVar9,(ulong)uVar5,pcVar10);
    op = op + iVar6;
    if ((insn->field_6).field_1.bb_false != (basic_block *)0x0) {
      psVar3 = (insn->field_6).field_5.orig_type;
      if (psVar3->ident == (ident *)0x0) {
        iVar6 = sprintf(op,"; <anon symbol:%p>",psVar3);
      }
      else {
        pcVar9 = dmrC_show_ident(C,psVar3->ident);
        iVar6 = sprintf(op,"; %s",pcVar9);
      }
      op = op + iVar6;
    }
    break;
  case 0x2a:
  case 0x39:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    uVar5 = (insn->field_6).field_5.offset;
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(op,"%s -> %d[%s]",pcVar9,(ulong)uVar5,pcVar10);
    op = op + iVar6;
    if ((insn->field_6).field_1.bb_false != (basic_block *)0x0) {
      psVar3 = (insn->field_6).field_5.orig_type;
      if (psVar3->ident == (ident *)0x0) {
        iVar6 = sprintf(op,"; <anon symbol:%p>",psVar3);
      }
      else {
        pcVar9 = dmrC_show_ident(C,psVar3->ident);
        iVar6 = sprintf(op,"; %s",pcVar9);
      }
      op = op + iVar6;
    }
    break;
  case 0x2b:
    pbVar2 = (insn->field_6).field_1.bb_false;
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar6 = sprintf(op,"%s <- ",pcVar9);
    op = op + iVar6;
    if (pbVar2 == (basic_block *)0x0) {
      iVar6 = sprintf(op,"%s","<none>");
      op = op + iVar6;
    }
    else {
      switch(*(undefined1 *)&pbVar2->pos) {
      case 1:
        iVar6 = sprintf(op,"%lld",pbVar2->parents);
        op = op + iVar6;
        break;
      case 2:
        pcVar9 = dmrC_show_string(C,(string *)pbVar2->children);
        iVar6 = sprintf(op,"%.40s",pcVar9);
        op = op + iVar6;
        break;
      case 3:
        pcVar9 = dmrC_show_ident(C,(ident *)pbVar2->parents->allocator_);
        iVar6 = sprintf(op,"%s",pcVar9);
        op = op + iVar6;
        break;
      default:
        iVar6 = sprintf(op,"SETVAL EXPR TYPE %d",(ulong)(*(ushort *)&pbVar2->pos & 0xff));
        op = op + iVar6;
        break;
      case 0x17:
        if (pbVar2->parents->list_[0x16] != (basic_block *)0x0) {
          iVar6 = sprintf(op,".L%u",(ulong)pbVar2->parents->list_[0x16]->nr);
          op = op + iVar6;
        }
        break;
      case 0x1c:
        iVar6 = sprintf(op,"%Lf");
        op = op + iVar6;
      }
    }
    break;
  case 0x2c:
    pbVar1 = ((insn->field_6).field_1.bb_true)->parents;
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar6 = sprintf(op,"%s <- ",pcVar9);
    op = op + iVar6;
    if ((insn->bb != (basic_block *)0x0) || (pbVar1 != (basic_block_list *)0x0)) {
      if (pbVar1->list_[0x16] == (basic_block *)0x0) {
        if (pbVar1->allocator_ == (allocator *)0x0) {
          iVar6 = sprintf(op,"<anon symbol:%p>",pbVar1);
          op = op + iVar6;
        }
        else {
          pcVar9 = dmrC_show_ident(C,(ident *)pbVar1->allocator_);
          iVar6 = sprintf(op,"%s",pcVar9);
          op = op + iVar6;
        }
      }
      else {
        iVar6 = sprintf(op,".L%u",(ulong)pbVar1->list_[0x16]->nr);
        op = op + iVar6;
      }
    }
    break;
  case 0x2e:
    phiiter___1._16_8_ = anon_var_dwarf_3baf4;
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar6 = sprintf(op,"%s",pcVar9);
    op = op + iVar6;
    ptrlist_forward_iterator((ptr_list_iter *)&sym_2,(ptr_list *)(insn->field_6).field_1.bb_true);
    s = (char *)ptrlist_iter_next((ptr_list_iter *)&sym_2);
    while (uVar4 = phiiter___1._16_8_, s != (char *)0x0) {
      pcVar9 = dmrC_show_pseudo(C,(pseudo_t)s);
      iVar6 = sprintf(op,"%s %s",uVar4,pcVar9);
      op = op + iVar6;
      phiiter___1._16_8_ = anon_var_dwarf_3bb0a;
      s = (char *)ptrlist_iter_next((ptr_list_iter *)&sym_2);
    }
    break;
  case 0x2f:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(op,"%s <- %s    ",pcVar9,pcVar10);
    op = op + iVar6;
    ptrlist_forward_iterator((ptr_list_iter *)&phi_1,(ptr_list *)(insn->field_6).field_1.bb_false);
    phiiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&phi_1);
    while (phiiter__._16_8_ != 0) {
      pcVar9 = dmrC_show_pseudo(C,*(pseudo_t *)(phiiter__._16_8_ + 0x20));
      iVar6 = sprintf(op," (%s)",pcVar9);
      op = op + iVar6;
      phiiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&phi_1);
    }
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    uVar5 = type_size((insn->field_6).field_5.orig_type);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(op,"%s <- (%d) %s",pcVar9,(ulong)uVar5,pcVar10);
    op = op + iVar6;
    break;
  case 0x34:
  case 0x35:
    if (((insn->field_5).target != (pseudo_t)0x0) && ((insn->field_5).target != &C->L->void_pseudo))
    {
      pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
      iVar6 = sprintf(op,"%s <- ",pcVar9);
      op = op + iVar6;
    }
    pcVar9 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(op,"%s",pcVar9);
    op = op + iVar6;
    ptrlist_forward_iterator
              ((ptr_list_iter *)local_100,(ptr_list *)(insn->field_6).field_1.bb_false);
    argiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_100);
    while (argiter__._16_8_ != 0) {
      pcVar9 = dmrC_show_pseudo(C,(pseudo_t)argiter__._16_8_);
      iVar6 = sprintf(op,", %s",pcVar9);
      op = op + iVar6;
      argiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_100);
    }
    break;
  case 0x38:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(op,"%s <- %s, %d, %d",pcVar9,pcVar10,(ulong)(insn->field_6).field_7.from,
                    (ulong)(insn->field_6).field_7.len);
    op = op + iVar6;
    break;
  case 0x3b:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(op,"%s <- %s",pcVar9,pcVar10);
    op = op + iVar6;
    break;
  case 0x3c:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar6 = sprintf(op,"%s",pcVar9);
    op = op + iVar6;
    break;
  case 0x3d:
    op = show_asm(C,op,insn);
    break;
  case 0x3e:
    pcVar9 = "";
    if ((insn->field_6).field_10.check != 0) {
      pcVar9 = "check: ";
    }
    iVar6 = sprintf(op,"%s%d",pcVar9,(ulong)(uint)(insn->field_6).field_10.increment);
    op = op + iVar6;
    break;
  case 0x3f:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_6.src2);
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_6.src3);
    iVar6 = sprintf(op,"%s between %s..%s",pcVar9,pcVar10,pcVar8);
    op = op + iVar6;
    break;
  case 0x40:
    pcVar9 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar6 = sprintf(op,"%s <- %s",pcVar9,pcVar10);
    op = op + iVar6;
  }
  pcVar9 = op;
  if (&C->L->n <= op) {
    dmrC_die(C,"instruction buffer overflowed %td\n",(long)op - (long)C->L->buffer);
  }
  do {
    op = pcVar9;
    pcVar9 = op + -1;
  } while (op[-1] == ' ');
  *op = '\0';
  return C->L->buffer;
}

Assistant:

const char *dmrC_show_instruction(struct dmr_C *C, struct instruction *insn)
{
	int opcode = insn->opcode;
	char *buf;

	buf = C->L->buffer;
	if (!insn->bb)
		buf += sprintf(buf, "# ");

	if (opcode < (int)ARRAY_SIZE(opcodes)) {
		const char *op = opcodes[opcode];
		if (!op)
			buf += sprintf(buf, "opcode:%d", opcode);
		else
			buf += sprintf(buf, "%s", op);
		if (insn->type && dmrC_is_float_type(C->S, insn->type))
			buf += sprintf(buf, ".f%d", insn->size);
		else if (insn->size)
			buf += sprintf(buf, ".%d", insn->size);
		if (insn->type) {
			if (dmrC_is_ptr_type(insn->type))
				buf += sprintf(buf, "*");
		}

		memset(buf, ' ', 20);
		buf++;
	}

	if (buf < C->L->buffer + 12)
		buf = C->L->buffer + 12;
	switch (opcode) {
	case OP_RET:
		if (insn->src && insn->src != VOID_PSEUDO(C))
			buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->src));
		break;
	case OP_CBR:
		buf += sprintf(buf, "%s, .L%u, .L%u", dmrC_show_pseudo(C, insn->cond), insn->bb_true->nr, insn->bb_false->nr);
		break;

	case OP_BR:
		buf += sprintf(buf, ".L%u", insn->bb_true->nr);
		break;

	case OP_SYMADDR: {
		struct symbol *sym = insn->symbol->sym;
		buf += sprintf(buf, "%s <- ", dmrC_show_pseudo(C, insn->target));

		if (!insn->bb && !sym)
			break;
		if (sym->bb_target) {
			buf += sprintf(buf, ".L%u", sym->bb_target->nr);
			break;
		}
		if (sym->ident) {
			buf += sprintf(buf, "%s", dmrC_show_ident(C, sym->ident));
			break;
		}
		buf += sprintf(buf, "<anon symbol:%p>", sym);
		break;
	}
		
	case OP_SETVAL: {
		struct expression *expr = insn->val;
		struct symbol *sym;
		buf += sprintf(buf, "%s <- ", dmrC_show_pseudo(C, insn->target));

		if (!expr) {
			buf += sprintf(buf, "%s", "<none>");
			break;
		}
			
		switch (expr->type) {
		case EXPR_VALUE:
			buf += sprintf(buf, "%lld", expr->value);
			break;
		case EXPR_FVALUE:
			buf += sprintf(buf, "%Lf", expr->fvalue);
			break;
		case EXPR_STRING:
			buf += sprintf(buf, "%.40s", dmrC_show_string(C, expr->string));
			break;
		case EXPR_SYMBOL:
			buf += sprintf(buf, "%s", dmrC_show_ident(C, expr->symbol->ident));
			break;
		case EXPR_LABEL:
			sym = expr->symbol;
			if (sym->bb_target)
				buf += sprintf(buf, ".L%u", sym->bb_target->nr);
			break;
		default:
			buf += sprintf(buf, "SETVAL EXPR TYPE %d", expr->type);
		}
		break;
	}
	case OP_SWITCH: {
		struct multijmp *jmp;
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->cond));
		FOR_EACH_PTR(insn->multijmp_list, jmp) {
			if (jmp->begin == jmp->end)
				buf += sprintf(buf, ", %lld -> .L%u", jmp->begin, jmp->target->nr);
			else if (jmp->begin < jmp->end)
				buf += sprintf(buf, ", %lld ... %lld -> .L%u", jmp->begin, jmp->end, jmp->target->nr);
			else
				buf += sprintf(buf, ", default -> .L%u", jmp->target->nr);
		} END_FOR_EACH_PTR(jmp);
		break;
	}
	case OP_COMPUTEDGOTO: {
		struct multijmp *jmp;
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->target));
		FOR_EACH_PTR(insn->multijmp_list, jmp) {
			buf += sprintf(buf, ", .L%u", jmp->target->nr);
		} END_FOR_EACH_PTR(jmp);
		break;
	}

	case OP_PHISOURCE: {
		struct instruction *phi;
		buf += sprintf(buf, "%s <- %s    ", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->phi_src));
		FOR_EACH_PTR(insn->phi_users, phi) {
			buf += sprintf(buf, " (%s)", dmrC_show_pseudo(C, phi->target));
		} END_FOR_EACH_PTR(phi);
		break;
	}

	case OP_PHI: {
		pseudo_t phi;
		const char *s = " <-";
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->target));
		FOR_EACH_PTR(insn->phi_list, phi) {
			buf += sprintf(buf, "%s %s", s, dmrC_show_pseudo(C, phi));
			s = ",";
		} END_FOR_EACH_PTR(phi);
		break;
	}	
	case OP_LOAD: case OP_LNOP:
		buf += sprintf(buf, "%s <- %d[%s]", dmrC_show_pseudo(C, insn->target), insn->offset, dmrC_show_pseudo(C, insn->src));
		if (insn->orig_type) {
			struct symbol *sym = insn->orig_type;
			if (sym->ident) {
				buf += sprintf(buf, "; %s", dmrC_show_ident(C, sym->ident));
			}
			else {
				buf += sprintf(buf, "; <anon symbol:%p>", sym);
			}
		}
		break;
	case OP_STORE: case OP_SNOP:
		buf += sprintf(buf, "%s -> %d[%s]", dmrC_show_pseudo(C, insn->target), insn->offset, dmrC_show_pseudo(C, insn->src));
		if (insn->orig_type) {
			struct symbol *sym = insn->orig_type;
			if (sym->ident) {
				buf += sprintf(buf, "; %s", dmrC_show_ident(C, sym->ident));
			}
			else {
				buf += sprintf(buf, "; <anon symbol:%p>", sym);
			}
		}
		break;
	case OP_INLINED_CALL:
	case OP_CALL: {
		if (insn->target && insn->target != VOID_PSEUDO(C))
			buf += sprintf(buf, "%s <- ", dmrC_show_pseudo(C, insn->target));
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->func));
		{
			struct pseudo *arg;
			FOR_EACH_PTR(insn->arguments, arg) {
				buf += sprintf(buf, ", %s", dmrC_show_pseudo(C, arg));
			} END_FOR_EACH_PTR(arg);
		}
		break;
	}
	case OP_CAST:
	case OP_SCAST:
	case OP_FPCAST:
	case OP_PTRCAST:
		buf += sprintf(buf, "%s <- (%d) %s",
			dmrC_show_pseudo(C, insn->target),
			type_size(insn->orig_type),
			dmrC_show_pseudo(C, insn->src));
		break;
	case OP_ADD:
	case OP_SUB:
	case OP_MULU:
	case OP_MULS:
	case OP_DIVU:
	case OP_DIVS:
	case OP_MODU: 
	case OP_MODS:
	case OP_SHL:
	case OP_LSR: 
	case OP_ASR:
	case OP_AND:
	case OP_OR:      
	case OP_XOR:
	case OP_AND_BOOL:
	case OP_OR_BOOL:
	case OP_SET_EQ:
	case OP_SET_NE:
	case OP_SET_LE:
	case OP_SET_GE:
	case OP_SET_LT:
	case OP_SET_GT:
	case OP_SET_B:
	case OP_SET_A:
	case OP_SET_BE:
	case OP_SET_AE:

		buf += sprintf(buf, "%s <- %s, %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src1), dmrC_show_pseudo(C, insn->src2));
		break;

	case OP_SEL:
		buf += sprintf(buf, "%s <- %s, %s, %s", dmrC_show_pseudo(C, insn->target),
			dmrC_show_pseudo(C, insn->src1), dmrC_show_pseudo(C, insn->src2), dmrC_show_pseudo(C, insn->src3));
		break;

	case OP_SLICE:
		buf += sprintf(buf, "%s <- %s, %d, %d", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->base), insn->from, insn->len);
		break;

	case OP_NOT: case OP_NEG:
		buf += sprintf(buf, "%s <- %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src1));
		break;

	case OP_CONTEXT:
		buf += sprintf(buf, "%s%d", insn->check ? "check: " : "", insn->increment);
		break;
	case OP_RANGE:
		buf += sprintf(buf, "%s between %s..%s", dmrC_show_pseudo(C, insn->src1), dmrC_show_pseudo(C, insn->src2), dmrC_show_pseudo(C, insn->src3));
		break;
	case OP_NOP:
		buf += sprintf(buf, "%s <- %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src1));
		break;
	case OP_DEATHNOTE:
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->target));
		break;
	case OP_ASM:
		buf = show_asm(C, buf, insn);
		break;
	case OP_COPY:
		buf += sprintf(buf, "%s <- %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src));
		break;
	default:
		break;
	}

	if (buf >= C->L->buffer + sizeof(C->L->buffer))
		dmrC_die(C, "instruction buffer overflowed %td\n", buf - C->L->buffer);
	do { --buf; } while (*buf == ' ');
	*++buf = 0;
	return C->L->buffer;
}